

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

void absl::lts_20250127::cord_internal::CordRepBtree::Rebuild
               (CordRepBtree **stack,CordRepBtree *tree,bool consume)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  CordRep *pCVar6;
  size_t sVar7;
  bool bVar8;
  long lVar9;
  uint8_t uVar10;
  ulong uVar11;
  CordRepBtree *pCVar12;
  CordRepBtree *pCVar13;
  CordRepBtree *pCVar14;
  CordRepBtree **ppCVar15;
  CordRep **ppCVar16;
  undefined7 in_register_00000011;
  CordRep **ppCVar17;
  ulong uVar18;
  size_t new_end;
  long lVar19;
  ulong uVar20;
  bool consume_00;
  
  if ((int)CONCAT71(in_register_00000011,consume) == 0) {
    consume_00 = false;
  }
  else {
    consume_00 = (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2;
  }
  bVar3 = (tree->super_CordRep).storage[1];
  bVar4 = (tree->super_CordRep).storage[2];
  if ((tree->super_CordRep).storage[0] == '\0') {
    if (bVar3 != bVar4) {
      ppCVar17 = tree->edges_ + bVar3;
      do {
        pCVar6 = *ppCVar17;
        if (consume_00 == false) {
          if (pCVar6 == (CordRep *)0x0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          (pCVar6->refcount).count_.super___atomic_base<int>._M_i =
               (pCVar6->refcount).count_.super___atomic_base<int>._M_i + 2;
          UNLOCK();
        }
        sVar7 = pCVar6->length;
        pCVar14 = *stack;
        bVar3 = (pCVar14->super_CordRep).storage[2];
        bVar5 = (pCVar14->super_CordRep).storage[1];
        uVar11 = (ulong)bVar5;
        uVar20 = bVar3 - uVar11;
        if (uVar20 < 6) {
          if (uVar11 != 0) {
            (pCVar14->super_CordRep).storage[1] = '\0';
            (pCVar14->super_CordRep).storage[2] = (uint8_t)uVar20;
            if (bVar3 != bVar5) {
              ppCVar16 = pCVar14->edges_;
              uVar18 = uVar20;
              do {
                *ppCVar16 = ppCVar16[uVar11];
                ppCVar16 = ppCVar16 + 1;
                uVar18 = uVar18 - 1;
              } while (uVar18 != 0);
            }
          }
          bVar3 = (pCVar14->super_CordRep).storage[2];
          (pCVar14->super_CordRep).storage[2] = bVar3 + 1;
          pCVar14->edges_[bVar3] = pCVar6;
          (pCVar14->super_CordRep).length = (pCVar14->super_CordRep).length + sVar7;
          pCVar12 = pCVar14;
        }
        else {
          pCVar12 = (CordRepBtree *)operator_new(0x40);
          (pCVar12->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          if (pCVar6->tag == '\x03') {
            uVar10 = pCVar6->storage[0] + '\x01';
          }
          else {
            uVar10 = '\0';
          }
          (pCVar12->super_CordRep).length = pCVar6->length;
          (pCVar12->super_CordRep).tag = '\x03';
          (pCVar12->super_CordRep).storage[0] = uVar10;
          (pCVar12->super_CordRep).storage[1] = '\0';
          (pCVar12->super_CordRep).storage[2] = '\x01';
          pCVar12->edges_[0] = pCVar6;
        }
        lVar19 = 1;
        if (5 < uVar20) {
          lVar9 = 0;
          do {
            lVar19 = lVar9;
            stack[lVar19] = pCVar12;
            pCVar13 = stack[lVar19 + 1];
            if (pCVar13 == (CordRepBtree *)0x0) {
              uVar10 = (pCVar14->super_CordRep).storage[0];
              if (uVar10 != (pCVar12->super_CordRep).storage[0]) {
                __assert_fail("front->height() == back->height()",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                              ,0x294,
                              "static CordRepBtree *absl::cord_internal::CordRepBtree::New(CordRepBtree *, CordRepBtree *)"
                             );
              }
              pCVar13 = (CordRepBtree *)operator_new(0x40);
              (pCVar13->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
              (pCVar13->super_CordRep).length =
                   (pCVar12->super_CordRep).length + (pCVar14->super_CordRep).length;
              (pCVar13->super_CordRep).tag = '\x03';
              (pCVar13->super_CordRep).storage[0] = uVar10 + '\x01';
              (pCVar13->super_CordRep).storage[1] = '\0';
              (pCVar13->super_CordRep).storage[2] = '\x02';
              pCVar13->edges_[0] = &pCVar14->super_CordRep;
              pCVar13->edges_[1] = &pCVar12->super_CordRep;
              stack[lVar19 + 1] = pCVar13;
              bVar8 = false;
            }
            else {
              bVar3 = (pCVar13->super_CordRep).storage[2];
              bVar5 = (pCVar13->super_CordRep).storage[1];
              uVar11 = (ulong)bVar5;
              uVar20 = bVar3 - uVar11;
              pCVar14 = pCVar13;
              if (uVar20 < 6) {
                if (uVar11 != 0) {
                  (pCVar13->super_CordRep).storage[1] = '\0';
                  (pCVar13->super_CordRep).storage[2] = (uint8_t)uVar20;
                  if (bVar3 != bVar5) {
                    ppCVar16 = pCVar13->edges_;
                    do {
                      *ppCVar16 = ppCVar16[uVar11];
                      ppCVar16 = ppCVar16 + 1;
                      uVar20 = uVar20 - 1;
                    } while (uVar20 != 0);
                  }
                }
                bVar3 = (pCVar13->super_CordRep).storage[2];
                (pCVar13->super_CordRep).storage[2] = bVar3 + 1;
                pCVar13->edges_[bVar3] = &pCVar12->super_CordRep;
                (pCVar13->super_CordRep).length = (pCVar13->super_CordRep).length + sVar7;
                bVar8 = false;
                pCVar12 = pCVar13;
              }
              else {
                pCVar13 = (CordRepBtree *)operator_new(0x40);
                (pCVar13->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
                if ((pCVar12->super_CordRep).tag == '\x03') {
                  uVar10 = (pCVar12->super_CordRep).storage[0] + '\x01';
                }
                else {
                  uVar10 = '\0';
                }
                (pCVar13->super_CordRep).length = (pCVar12->super_CordRep).length;
                (pCVar13->super_CordRep).tag = '\x03';
                (pCVar13->super_CordRep).storage[0] = uVar10;
                (pCVar13->super_CordRep).storage[1] = '\0';
                (pCVar13->super_CordRep).storage[2] = '\x01';
                pCVar13->edges_[0] = &pCVar12->super_CordRep;
                bVar8 = true;
                pCVar12 = pCVar13;
              }
            }
            lVar9 = lVar19 + 1;
          } while (bVar8);
          lVar19 = lVar19 + 2;
        }
        pCVar14 = stack[lVar19];
        if (pCVar14 != (CordRepBtree *)0x0) {
          ppCVar15 = stack + lVar19 + 1;
          do {
            (pCVar14->super_CordRep).length = (pCVar14->super_CordRep).length + sVar7;
            pCVar14 = *ppCVar15;
            ppCVar15 = ppCVar15 + 1;
          } while (pCVar14 != (CordRepBtree *)0x0);
        }
        ppCVar17 = ppCVar17 + 1;
      } while (ppCVar17 != tree->edges_ + bVar4);
    }
  }
  else if (bVar3 != bVar4) {
    lVar19 = (ulong)bVar3 << 3;
    do {
      pCVar14 = *(CordRepBtree **)((long)tree->edges_ + lVar19);
      if ((pCVar14->super_CordRep).tag != '\x03') {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      Rebuild(stack,pCVar14,consume_00);
      lVar19 = lVar19 + 8;
    } while ((ulong)bVar4 * 8 != lVar19);
  }
  if (consume) {
    if (consume_00 == false) {
      if (tree == (CordRepBtree *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x397,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
      }
      LOCK();
      pRVar1 = &(tree->super_CordRep).refcount;
      uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
        __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0xac,
                      "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
      }
      if (uVar2 == 2) {
        CordRep::Destroy(&tree->super_CordRep);
        return;
      }
    }
    else if (tree != (CordRepBtree *)0x0) {
      operator_delete(tree,0x40);
      return;
    }
  }
  return;
}

Assistant:

void CordRepBtree::Rebuild(CordRepBtree** stack, CordRepBtree* tree,
                           bool consume) {
  bool owned = consume && tree->refcount.IsOne();
  if (tree->height() == 0) {
    for (CordRep* edge : tree->Edges()) {
      if (!owned) edge = CordRep::Ref(edge);
      size_t height = 0;
      size_t length = edge->length;
      CordRepBtree* node = stack[0];
      OpResult result = node->AddEdge<kBack>(true, edge, length);
      while (result.action == CordRepBtree::kPopped) {
        stack[height] = result.tree;
        if (stack[++height] == nullptr) {
          result.action = CordRepBtree::kSelf;
          stack[height] = CordRepBtree::New(node, result.tree);
        } else {
          node = stack[height];
          result = node->AddEdge<kBack>(true, result.tree, length);
        }
      }
      while (stack[++height] != nullptr) {
        stack[height]->length += length;
      }
    }
  } else {
    for (CordRep* rep : tree->Edges()) {
      Rebuild(stack, rep->btree(), owned);
    }
  }
  if (consume) {
    if (owned) {
      CordRepBtree::Delete(tree);
    } else {
      CordRepBtree::Unref(tree);
    }
  }
}